

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O0

void __thiscall cmQtAutoGeneratorRcc::SettingsFileWrite(cmQtAutoGeneratorRcc *this)

{
  bool bVar1;
  Logger *pLVar2;
  FileSystem *pFVar3;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string content;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmQtAutoGeneratorRcc *local_10;
  cmQtAutoGeneratorRcc *this_local;
  
  local_10 = this;
  if ((this->SettingsChanged_ & 1U) != 0) {
    pLVar2 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
    bVar1 = cmQtAutoGenerator::Logger::Verbose(pLVar2);
    if (bVar1) {
      pLVar2 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
      cmQtAutoGen::Quoted(&local_50,&this->SettingsFile_);
      std::operator+(&local_30,"Writing settings file ",&local_50);
      cmQtAutoGenerator::Logger::Info(pLVar2,RCC,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"rcc:",&local_81);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::operator+=((string *)local_80,(string *)&this->SettingsString_);
    std::__cxx11::string::operator+=((string *)local_80,'\n');
    pFVar3 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
    bVar1 = cmQtAutoGenerator::FileSystem::FileWrite
                      (pFVar3,RCC,&this->SettingsFile_,(string *)local_80);
    if (!bVar1) {
      pLVar2 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Settings file writing failed",&local_a9);
      cmQtAutoGenerator::Logger::ErrorFile(pLVar2,RCC,&this->SettingsFile_,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      pFVar3 = cmQtAutoGenerator::FileSys(&this->super_cmQtAutoGenerator);
      cmQtAutoGenerator::FileSystem::FileRemove(pFVar3,&this->SettingsFile_);
      this->Error_ = true;
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  cmFileLock::Release(&this->LockFileLock_);
  return;
}

Assistant:

void cmQtAutoGeneratorRcc::SettingsFileWrite()
{
  // Only write if any setting changed
  if (SettingsChanged_) {
    if (Log().Verbose()) {
      Log().Info(GenT::RCC, "Writing settings file " + Quoted(SettingsFile_));
    }
    // Write settings file
    std::string content = "rcc:";
    content += SettingsString_;
    content += '\n';
    if (!FileSys().FileWrite(GenT::RCC, SettingsFile_, content)) {
      Log().ErrorFile(GenT::RCC, SettingsFile_,
                      "Settings file writing failed");
      // Remove old settings file to trigger a full rebuild on the next run
      FileSys().FileRemove(SettingsFile_);
      Error_ = true;
    }
  }

  // Unlock the lock file
  LockFileLock_.Release();
}